

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_ClearNoResize_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ClearNoResize_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  size_type sVar1;
  undefined8 *puVar2;
  pointer ppVar3;
  int iVar4;
  pair<const_int,_int> pVar5;
  char *in_R9;
  int index;
  bool bVar6;
  size_type last_bucket_count;
  AssertHelper local_90;
  pair<const_int,_int> local_88;
  undefined8 *local_80;
  AssertHelper local_78;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  local_70;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_48;
  HashtableAllTest_ClearNoResize_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_40;
  size_type local_38;
  
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  sVar1 = (this->
          super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.num_buckets;
  index = 2;
  do {
    iVar4 = index;
    local_88 = UniqueObjectHelper<std::pair<int_const,int>>(iVar4 + -1);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(&local_70,
             &this_00->
              super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ,&local_88);
    local_38 = (this->
               super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.num_buckets;
    index = iVar4 + 1;
  } while (local_38 == sVar1);
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::clear_no_resize(&(this->
                     super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     ).
                     super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     .ht_.
                     super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     .ht_.rep);
  local_88 = *(value_type *)
              &(this->
               super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.num_buckets;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_70,"last_bucket_count","this->ht_.bucket_count()",&local_38,
             (unsigned_long *)&local_88);
  if ((char)local_70.first.super_iterator.ht == '\0') {
    testing::Message::Message((Message *)&local_88);
    if (local_70.first.super_iterator.pos == (pointer)0x0) {
      pVar5 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar5 = *local_70.first.super_iterator.pos;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1bf,(char *)pVar5);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88 != (value_type)0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  ppVar3 = local_70.first.super_iterator.pos;
  if (local_70.first.super_iterator.pos != (pointer)0x0) {
    if (*local_70.first.super_iterator.pos !=
        (pair<const_int,_int>)(local_70.first.super_iterator.pos + 2)) {
      operator_delete((void *)*local_70.first.super_iterator.pos);
    }
    operator_delete(ppVar3);
  }
  bVar6 = (this->
          super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.num_elements ==
          (this->
          super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.num_deleted;
  local_88.first._0_1_ = bVar6;
  local_80 = (undefined8 *)0x0;
  if (!bVar6) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_70,(internal *)&local_88,(AssertionResult *)"this->ht_.empty()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1c0,(char *)CONCAT71(local_70.first.super_iterator.ht._1_7_,
                                       (char)local_70.first.super_iterator.ht));
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((pointer *)
        CONCAT71(local_70.first.super_iterator.ht._1_7_,(char)local_70.first.super_iterator.ht) !=
        &local_70.first.super_iterator.end) {
      operator_delete((undefined1 *)
                      CONCAT71(local_70.first.super_iterator.ht._1_7_,
                               (char)local_70.first.super_iterator.ht));
    }
    if (local_90.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
    puVar2 = local_80;
    if (local_80 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_80 != local_80 + 2) {
        operator_delete((undefined8 *)*local_80);
      }
      operator_delete(puVar2);
    }
  }
  iVar4 = iVar4 + -1;
  local_48 = &this_00->
              super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ;
  local_40 = this;
  do {
    local_88 = UniqueObjectHelper<std::pair<int_const,int>>(index);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(&local_70,local_48,&local_88);
    local_88 = *(value_type *)
                &(local_40->
                 super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ).
                 super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.
                 super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.rep.num_buckets;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_70,"last_bucket_count","this->ht_.bucket_count()",&local_38,
               (unsigned_long *)&local_88);
    if ((char)local_70.first.super_iterator.ht == '\0') {
      testing::Message::Message((Message *)&local_88);
      pVar5 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
      if (local_70.first.super_iterator.pos != (pointer)0x0) {
        pVar5 = *local_70.first.super_iterator.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x1c6,(char *)pVar5);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if (local_88 != (value_type)0x0) {
        (**(code **)(*(long *)local_88 + 8))();
      }
    }
    ppVar3 = local_70.first.super_iterator.pos;
    if (local_70.first.super_iterator.pos != (pointer)0x0) {
      if (*local_70.first.super_iterator.pos !=
          (pair<const_int,_int>)(local_70.first.super_iterator.pos + 2)) {
        operator_delete((void *)*local_70.first.super_iterator.pos);
      }
      operator_delete(ppVar3);
    }
    index = index + 1;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ClearNoResize) {
  if (!this->ht_.supports_clear_no_resize()) return;
  typename TypeParam::size_type empty_bucket_count = this->ht_.bucket_count();
  int last_element = 1;
  while (this->ht_.bucket_count() == empty_bucket_count) {
    this->ht_.insert(this->UniqueObject(last_element));
    ++last_element;
  }
  typename TypeParam::size_type last_bucket_count = this->ht_.bucket_count();
  this->ht_.clear_no_resize();
  EXPECT_EQ(last_bucket_count, this->ht_.bucket_count());
  EXPECT_TRUE(this->ht_.empty());

  // When inserting the same number of elements again, no resize
  // should be necessary.
  for (int i = 1; i < last_element; ++i) {
    this->ht_.insert(this->UniqueObject(last_element + i));
    EXPECT_EQ(last_bucket_count, this->ht_.bucket_count());
  }
}